

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void dump_attr_sublist(FILE *out,attr_list list,int indent)

{
  uint uVar1;
  undefined4 uVar2;
  char *pcVar3;
  ushort **ppuVar4;
  long lVar5;
  char *__ptr;
  int in_EDX;
  long in_RSI;
  FILE *in_RDI;
  char *print_str;
  char *atom_str;
  char *cv;
  int atom_val;
  attr_opaque_p o;
  int j_2;
  char *print_id_1;
  int j_1;
  char *print_name_1;
  char *attr_name_1;
  uchar c_1 [15];
  int attr_id_1;
  char *print_id;
  uint ip;
  int j;
  char *print_name;
  char *attr_name;
  uchar c [30];
  int attr_id;
  int i;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  uint in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  uint in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char *local_e0;
  char local_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  int local_b4;
  int local_a4;
  char *local_a0;
  undefined1 in_stack_ffffffffffffff74;
  byte in_stack_ffffffffffffff75;
  byte in_stack_ffffffffffffff76;
  byte in_stack_ffffffffffffff77;
  byte in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  undefined6 in_stack_ffffffffffffff7a;
  int local_6c;
  char *local_68;
  undefined4 local_58;
  undefined1 local_54;
  uint local_2c;
  int local_28;
  int local_24;
  long local_20;
  FILE *local_18;
  
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  init_global_atom_server((atom_server *)0x10880c);
  if (dump_attr_sublist::IP_ADDR == -1) {
    dump_attr_sublist::CM_ENET_ADDR =
         attr_atom_from_string
                   ((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    dump_attr_sublist::IP_ADDR =
         attr_atom_from_string
                   ((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    dump_attr_sublist::NNTI_ADDR =
         attr_atom_from_string
                   ((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    dump_attr_sublist::PEER_IP =
         attr_atom_from_string
                   ((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  if (local_20 == 0) {
    fprintf(local_18,"[NULL]\n");
  }
  else {
    for (local_28 = 0; local_28 < (int)(uint)*(byte *)(*(long *)(local_20 + 0x10) + 1);
        local_28 = local_28 + 1) {
      local_2c = *(uint *)(*(long *)(local_20 + 0x10) + 4 + (long)local_28 * 8);
      pcVar3 = string_from_atom((atom_server)
                                CONCAT62(in_stack_ffffffffffffff7a,
                                         CONCAT11(in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78)),
                                CONCAT13(in_stack_ffffffffffffff77,
                                         CONCAT12(in_stack_ffffffffffffff76,
                                                  CONCAT11(in_stack_ffffffffffffff75,
                                                           in_stack_ffffffffffffff74))));
      local_58 = local_2c;
      local_54 = 0;
      local_68 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        local_68 = "<null attr name>";
      }
      for (local_6c = 0; local_6c < local_24; local_6c = local_6c + 1) {
        fprintf(local_18,"    ");
      }
      if ((((local_2c == dump_attr_sublist::CM_ENET_ADDR) ||
           (local_2c == dump_attr_sublist::IP_ADDR)) || (local_2c == dump_attr_sublist::NNTI_ADDR))
         || (local_2c == dump_attr_sublist::PEER_IP)) {
        uVar1 = *(uint *)(*(long *)(local_20 + 0x10) + 8 + (long)local_28 * 8);
        in_stack_fffffffffffffef8 = (uVar1 & 0xff0000) >> 0x10;
        in_stack_ffffffffffffff00 = (uVar1 & 0xff00) >> 8;
        fprintf(local_18,"    { %s (\'%c%c%c%c\'), Attr_Int4, %d.%d.%d.%d }\n",local_68,
                (ulong)(byte)local_58,(ulong)local_58._1_1_,(ulong)local_58._2_1_,local_58 >> 0x18,
                uVar1 >> 0x18,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,uVar1 & 0xff);
      }
      else {
        ppuVar4 = __ctype_b_loc();
        if (((((*ppuVar4)[(int)(local_58 & 0xff)] & 0x4000) == 0) ||
            (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(local_58 >> 8 & 0xff)] & 0x4000) == 0)) ||
           ((ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(local_58 >> 0x10 & 0xff)] & 0x4000) == 0
            || (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(local_58 >> 0x18)] & 0x4000) == 0)))) {
          sprintf((char *)&local_58,"0x%x",(ulong)local_2c);
        }
        fprintf(local_18,"    { %s (\'%s\'), Attr_Int4, %ld }\n",local_68,&local_58,
                (long)*(int *)(*(long *)(local_20 + 0x10) + 8 + (long)local_28 * 8));
      }
      if (pcVar3 != (char *)0x0) {
        free(pcVar3);
      }
    }
    for (local_28 = 0; local_28 < (int)(uint)*(byte *)(*(long *)(local_20 + 0x10) + 2);
        local_28 = local_28 + 1) {
      uVar1 = *(uint *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18);
      pcVar3 = string_from_atom((atom_server)
                                CONCAT62(in_stack_ffffffffffffff7a,
                                         CONCAT11(in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78)),
                                CONCAT13(in_stack_ffffffffffffff77,
                                         CONCAT12(in_stack_ffffffffffffff76,
                                                  CONCAT11(in_stack_ffffffffffffff75,
                                                           in_stack_ffffffffffffff74))));
      in_stack_ffffffffffffff75 = (byte)uVar1;
      in_stack_ffffffffffffff76 = (byte)(uVar1 >> 8);
      in_stack_ffffffffffffff77 = (byte)(uVar1 >> 0x10);
      in_stack_ffffffffffffff78 = (byte)(uVar1 >> 0x18);
      in_stack_ffffffffffffff79 = 0;
      ppuVar4 = __ctype_b_loc();
      if (((((*ppuVar4)[(int)(uint)in_stack_ffffffffffffff75] & 0x4000) == 0) ||
          (ppuVar4 = __ctype_b_loc(),
          ((*ppuVar4)[(int)(uint)in_stack_ffffffffffffff76] & 0x4000) == 0)) ||
         ((ppuVar4 = __ctype_b_loc(),
          ((*ppuVar4)[(int)(uint)in_stack_ffffffffffffff77] & 0x4000) == 0 ||
          (ppuVar4 = __ctype_b_loc(),
          ((*ppuVar4)[(int)(uint)in_stack_ffffffffffffff78] & 0x4000) == 0)))) {
        sprintf(&stack0xffffffffffffff75,"0x%x",(ulong)uVar1);
      }
      local_a0 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        local_a0 = "<null attr name>";
      }
      for (local_a4 = 0; local_a4 < local_24; local_a4 = local_a4 + 1) {
        printf("    ");
      }
      switch(*(undefined4 *)(*(long *)(local_20 + 8) + 4 + (long)local_28 * 0x18)) {
      case 0:
        printf("    { %s (\'%s\'), Undefined, Undefined }\n",local_a0,&stack0xffffffffffffff75);
        break;
      case 1:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x3ca,"void dump_attr_sublist(FILE *, attr_list, int)");
      case 2:
        printf("    { %s (\'%s\'), Attr_Int8, %ld }\n",local_a0,&stack0xffffffffffffff75,
               *(undefined8 *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18 + 8));
        break;
      case 3:
        if (*(long *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18 + 8) == 0) {
          printf("    { %s (\'%s\'), Attr_String, NULL }\n",local_a0,&stack0xffffffffffffff75);
        }
        else {
          printf("    { %s (\'%s\'), Attr_String, %s }\n",local_a0,&stack0xffffffffffffff75,
                 *(undefined8 *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18 + 8));
        }
        break;
      case 4:
        if (*(long *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18 + 8) == 0) {
          printf("    { %s (\'%s\'), Attr_Opaque, NULL }\n",local_a0,&stack0xffffffffffffff75);
        }
        else {
          lVar5 = *(long *)(local_20 + 8) + (long)local_28 * 0x18;
          printf("    { %s (\'%s\'), Attr_Opaque, \"",local_a0,&stack0xffffffffffffff75);
          for (local_b4 = 0; local_b4 < *(int *)(lVar5 + 8); local_b4 = local_b4 + 1) {
            printf("%c",(ulong)(uint)(int)*(char *)(*(long *)(lVar5 + 0x10) + (long)local_b4));
          }
          printf("\"\n            <");
          for (local_b4 = 0; local_b4 < *(int *)(lVar5 + 8); local_b4 = local_b4 + 1) {
            printf(" %02x",(ulong)*(byte *)(*(long *)(lVar5 + 0x10) + (long)local_b4));
          }
          printf(">}\n");
        }
        break;
      case 5:
        uVar2 = *(undefined4 *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18 + 8);
        __ptr = string_from_atom((atom_server)
                                 CONCAT62(in_stack_ffffffffffffff7a,
                                          CONCAT11(in_stack_ffffffffffffff79,
                                                   in_stack_ffffffffffffff78)),
                                 CONCAT13(in_stack_ffffffffffffff77,
                                          CONCAT12(in_stack_ffffffffffffff76,
                                                   CONCAT11(in_stack_ffffffffffffff75,
                                                            in_stack_ffffffffffffff74))));
        local_e0 = __ptr;
        if (__ptr == (char *)0x0) {
          local_e0 = "<null attr name>";
        }
        local_c4 = (char)uVar2;
        cStack_c3 = (char)((uint)uVar2 >> 8);
        cStack_c2 = (char)((uint)uVar2 >> 0x10);
        cStack_c1 = (char)((uint)uVar2 >> 0x18);
        printf("    { %s (\'%s\'), Attr_Atom, %s (\'%c%c%c%c\') }\n",local_a0,
               &stack0xffffffffffffff75,local_e0,(ulong)(uint)(int)local_c4,
               (ulong)(uint)(int)cStack_c3,(int)cStack_c2,(int)cStack_c1);
        if (__ptr != (char *)0x0) {
          free(__ptr);
        }
        break;
      case 6:
        printf("    { %s (\'%s\'), Attr_List, ->\n",local_a0,&stack0xffffffffffffff75);
        internal_dump_attr_list
                  ((FILE *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (attr_list)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef4);
        for (local_a4 = 0; local_a4 < local_24; local_a4 = local_a4 + 1) {
          printf("    ");
        }
        printf(" }\n");
        break;
      case 7:
        printf("    { %s (\'%s\'), Attr_Float8, %g }\n",
               *(undefined8 *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18 + 8),local_a0,
               &stack0xffffffffffffff75);
        break;
      case 8:
        printf("    { %s (\'%s\'), Attr_Float8, %g }\n",
               *(undefined8 *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18 + 8),local_a0,
               &stack0xffffffffffffff75);
        break;
      case 9:
        printf("    { %s (\'%s\'), Attr_Float8, %g }\n",
               *(undefined8 *)(*(long *)(local_20 + 8) + (long)local_28 * 0x18 + 8),local_a0,
               &stack0xffffffffffffff75);
      }
      if (pcVar3 != (char *)0x0) {
        free(pcVar3);
      }
    }
  }
  return;
}

Assistant:

static void
dump_attr_sublist(FILE *out, attr_list list, int indent)
{
    int i;
    static atom_t CM_ENET_ADDR = -1;
    static atom_t IP_ADDR = -1;
    static atom_t NNTI_ADDR = -1;
    static atom_t PEER_IP = -1;
    init_global_atom_server(&global_as);
    if (IP_ADDR == -1) {
	CM_ENET_ADDR = attr_atom_from_string("CM_ENET_ADDR");
	IP_ADDR  = attr_atom_from_string("IP_ADDR");
	NNTI_ADDR = attr_atom_from_string("NNTI_ADDR");
	PEER_IP = attr_atom_from_string("PEER_IP");
    }
    if (list == NULL) {
        fprintf(out, "[NULL]\n");
        return;
    }
    for (i = 0; i < list->l.list.iattrs->int_attr_count; i++) {
	int attr_id = list->l.list.iattrs->iattr[i].attr_id;
	unsigned char c[30];
        char *attr_name = string_from_atom(global_as, attr_id), *print_name;
        int j;
	memcpy(&c[0], &attr_id, 4);
	c[4] = 0;
	print_name = attr_name;
        if (attr_name == NULL)
            print_name = "<null attr name>";
        for (j = 0; j < indent; j++) {
            fprintf(out, "    ");
        }
	if ((attr_id == CM_ENET_ADDR) || (attr_id == IP_ADDR) ||
	     (attr_id == NNTI_ADDR) || (attr_id == PEER_IP)) {
	    /* built-in's we want to format differently */
	    unsigned int ip = list->l.list.iattrs->iattr[i].value;
	    fprintf(out, "    { %s ('%c%c%c%c'), Attr_Int4, %d.%d.%d.%d }\n", print_name,
		   c[0], c[1], c[2], c[3],
		   ((ip & 0xff000000) >> 24), ((ip & 0x00ff0000) >> 16), 
		   ((ip & 0x0000ff00) >> 8), (ip & 0x000000ff));
	} else {
	    char *print_id = (char*) &c[0];
	    if ((!isprint((int)c[0])) || (!isprint((int)c[1])) || (!isprint((int)c[2])) || 
		(!isprint((int)c[3]))) {
		sprintf(print_id, "0x%x", attr_id);
	    }
	    fprintf(out, "    { %s ('%s'), Attr_Int4, %ld }\n", print_name,
		   print_id, (long) list->l.list.iattrs->iattr[i].value);
	}
	if (attr_name) free(attr_name);
    }
	
    for (i = 0; i < list->l.list.iattrs->other_attr_count; i++) {
	int attr_id = list->l.list.attributes[i].attr_id;
	unsigned char c[15];
	char *attr_name = string_from_atom(global_as, attr_id);
        char *print_name;
        int j;
	char *print_id = (char*)&c[0];
	print_name = attr_name;
	memcpy(&c[0], &attr_id, 4);
	c[4] = 0;
	if (!isprint((int)c[0]) || !isprint((int)c[1]) || !isprint((int)c[2]) || !isprint((int)c[3])) {
	    sprintf(print_id, "0x%x", attr_id);
	}
        if (attr_name == NULL)
            print_name = "<null attr name>";
        for (j = 0; j < indent; j++) {
            printf("    ");
        }
        switch (list->l.list.attributes[i].val_type) {
        case Attr_Undefined:
            printf("    { %s ('%s'), Undefined, Undefined }\n", 
		   print_name, print_id);
            break;
        case Attr_Int4:
	    assert(0);
            break;
        case Attr_Int8:
            printf("    { %s ('%s'), Attr_Int8, %ld }\n", print_name,
		   print_id,
                   (long) list->l.list.attributes[i].value.u.l);
            break;
        case Attr_Float16:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_Float8:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_Float4:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_String:
            if (((char*)list->l.list.attributes[i].value.u.p) != NULL) {
                printf("    { %s ('%s'), Attr_String, %s }\n", 
		       print_name, print_id,
                       (char *) list->l.list.attributes[i].value.u.p);
            } else {
                printf("    { %s ('%s'), Attr_String, NULL }\n", 
		       print_name, print_id);
            }
            break;          
        case Attr_Opaque:
            if (((char*)list->l.list.attributes[i].value.u.p) != NULL) {
                int j;
                attr_opaque_p o =
                    (attr_opaque_p) &list->l.list.attributes[i].value.u.o;
                printf("    { %s ('%s'), Attr_Opaque, \"", 
		       print_name, print_id);
                for (j=0; j< o->length; j++) {
                    printf("%c", ((char*)o->buffer)[j]);
                }
                printf("\"\n            <");
                for (j=0; j< o->length; j++) {
                    printf(" %02x", ((unsigned char*)o->buffer)[j]);
                }
                printf(">}\n");
            } else {
                printf("    { %s ('%s'), Attr_Opaque, NULL }\n", 
		       print_name, print_id);
            }
            break;
        case Attr_Atom: {
	    int atom_val = (atom_t)(long)list->l.list.attributes[i].value.u.i;
	    char *cv = (char*)&atom_val;
	    char *atom_str, *print_str;
            print_str = atom_str = string_from_atom(global_as, atom_val);
	    if (atom_str == NULL)
		print_str = "<null attr name>";
            printf("    { %s ('%s'), Attr_Atom, %s ('%c%c%c%c') }\n", 
		   print_name, print_id,
                   (char *) print_str, cv[0], cv[1], cv[2], cv[3]);
	    if (atom_str) free(atom_str);
            break;
	}
        case Attr_List:
            printf("    { %s ('%s'), Attr_List, ->\n", print_name,
		   print_id);
            internal_dump_attr_list(out, (attr_list) list->l.list.attributes[i].value.u.p,
                                    indent+1);
            for (j = 0; j< indent; j++) {
                printf("    ");
            }
            printf(" }\n");
            break;
        }
        if (attr_name) free(attr_name);
    }
}